

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord2d> *value)

{
  bool bVar1;
  undefined1 local_38 [8];
  texcoord2d v;
  optional<tinyusdz::value::texcoord2d> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::texcoord2d>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,(texcoord2d *)local_38);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2d>::operator=
                (value,(texcoord2d *)local_38);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord2d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord2d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}